

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int is_adjust_var_based_part_enabled
              (AV1_COMMON *cm,PARTITION_SPEED_FEATURES *part_sf,BLOCK_SIZE bsize)

{
  bool local_29;
  int local_28;
  int is_360p_or_larger;
  int is_larger_qindex;
  BLOCK_SIZE bsize_local;
  PARTITION_SPEED_FEATURES *part_sf_local;
  AV1_COMMON *cm_local;
  uint local_4;
  
  if (part_sf->partition_search_type == '\x02') {
    if ((part_sf->adjust_var_based_rd_partitioning == 0) ||
       (2 < part_sf->adjust_var_based_rd_partitioning)) {
      local_4 = 0;
    }
    else if (bsize < BLOCK_32X64) {
      local_4 = 1;
    }
    else if (part_sf->adjust_var_based_rd_partitioning == 2) {
      if (cm->width < cm->height) {
        local_28 = cm->width;
      }
      else {
        local_28 = cm->height;
      }
      local_29 = false;
      if ((0x167 < local_28) && (local_29 = false, 0xbe < (cm->quant_params).base_qindex)) {
        local_29 = bsize == BLOCK_64X64;
      }
      local_4 = (uint)local_29;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_adjust_var_based_part_enabled(
    AV1_COMMON *const cm, const PARTITION_SPEED_FEATURES *const part_sf,
    BLOCK_SIZE bsize) {
  if (part_sf->partition_search_type != VAR_BASED_PARTITION) return 0;
  if (part_sf->adjust_var_based_rd_partitioning == 0 ||
      part_sf->adjust_var_based_rd_partitioning > 2)
    return 0;

  if (bsize <= BLOCK_32X32) return 1;
  if (part_sf->adjust_var_based_rd_partitioning == 2) {
    const int is_larger_qindex = cm->quant_params.base_qindex > 190;
    const int is_360p_or_larger = AOMMIN(cm->width, cm->height) >= 360;
    return is_360p_or_larger && is_larger_qindex && bsize == BLOCK_64X64;
  }
  return 0;
}